

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O1

ALCenum anon_unknown.dwarf_87689::EnumFromDevFmt(DevFmtChannels channels)

{
  runtime_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (channels < 8) {
    return *(ALCenum *)(&DAT_00179248 + (ulong)channels * 4);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,(uint)channels);
  std::operator+(&local_38,"Invalid DevFmtChannels: ",&sStack_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ALCenum EnumFromDevFmt(DevFmtChannels channels)
{
    switch(channels)
    {
    case DevFmtMono: return ALC_MONO_SOFT;
    case DevFmtStereo: return ALC_STEREO_SOFT;
    case DevFmtQuad: return ALC_QUAD_SOFT;
    case DevFmtX51: /* fall-through */
    case DevFmtX51Rear: return ALC_5POINT1_SOFT;
    case DevFmtX61: return ALC_6POINT1_SOFT;
    case DevFmtX71: return ALC_7POINT1_SOFT;
    case DevFmtAmbi3D: return ALC_BFORMAT3D_SOFT;
    }
    throw std::runtime_error{"Invalid DevFmtChannels: "+std::to_string(int(channels))};
}